

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

optional<tinyusdz::crate::Field> * __thiscall
tinyusdz::crate::CrateReader::GetField
          (optional<tinyusdz::crate::Field> *__return_storage_ptr__,CrateReader *this,Index index)

{
  size_type sVar1;
  const_reference value;
  CrateReader *this_local;
  Index index_local;
  
  sVar1 = ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::size
                    (&this->_fields);
  if (index.value < sVar1) {
    value = ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::
            operator[](&this->_fields,(ulong)index.value);
    nonstd::optional_lite::optional<tinyusdz::crate::Field>::
    optional<const_tinyusdz::crate::Field_&,_0>(__return_storage_ptr__,value);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::crate::Field>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<crate::Field> CrateReader::GetField(crate::Index index) const {

  if (index.value < _fields.size()) {
    return _fields[index.value];
  } else {
    return nonstd::nullopt;
  }
}